

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,SizeT inSize)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  UInt16 *pUVar5;
  long in_RDX;
  UInt16 *in_RSI;
  undefined4 *in_RDI;
  uint symbol;
  uint posState;
  uint ttt;
  UInt32 bound;
  UInt16 *prob;
  ELzmaDummy res;
  uint state;
  UInt16 *probs;
  Byte *bufLimit;
  UInt32 code;
  UInt32 range;
  uint local_d4;
  long local_c8;
  long local_b0;
  uint local_94;
  int local_90;
  uint local_8c;
  ushort *local_88;
  int local_7c;
  uint local_78;
  uint local_74;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  ushort *local_48;
  uint local_40;
  uint i;
  uint numDirectBits;
  uint posSlot;
  UInt16 *probLen;
  uint local_28;
  uint offset;
  uint limit;
  uint len;
  UInt16 *probLit;
  uint bit;
  uint symbol_1;
  uint offs;
  uint matchByte;
  
  offset = in_RDI[10];
  local_28 = in_RDI[0xb];
  pUVar5 = (UInt16 *)((long)in_RSI + in_RDX);
  lVar1 = *(long *)(in_RDI + 4);
  uVar4 = in_RDI[0x12];
  uVar2 = in_RDI[0x10] & (1 << ((byte)in_RDI[2] & 0x1f)) - 1U;
  probLit = in_RSI;
  if (offset < 0x1000000) {
    if (pUVar5 <= in_RSI) {
      return DUMMY_ERROR;
    }
    offset = offset << 8;
    probLit = (UInt16 *)((long)in_RSI + 1);
    local_28 = local_28 << 8 | (uint)(byte)*in_RSI;
  }
  uVar3 = (offset >> 0xb) * (uint)*(ushort *)(lVar1 + (ulong)(uVar4 << 4) * 2 + (ulong)uVar2 * 2);
  if (local_28 < uVar3) {
    local_48 = (ushort *)(lVar1 + 0xe6c);
    if ((in_RDI[0x11] != 0) || (in_RDI[0x10] != 0)) {
      if (*(long *)(in_RDI + 0xc) == 0) {
        local_b0 = *(long *)(in_RDI + 0xe);
      }
      else {
        local_b0 = *(long *)(in_RDI + 0xc);
      }
      local_48 = (ushort *)
                 ((long)local_48 +
                 (ulong)((((in_RDI[0x10] & (1 << ((byte)in_RDI[1] & 0x1f)) - 1U) <<
                          ((byte)*in_RDI & 0x1f)) +
                         ((int)(uint)*(byte *)(*(long *)(in_RDI + 6) + local_b0 + -1) >>
                         (8U - (char)*in_RDI & 0x1f))) * 0x300) * 2);
    }
    offset = uVar3;
    if (uVar4 < 7) {
      local_58 = 1;
      do {
        if (offset < 0x1000000) {
          if (pUVar5 <= probLit) {
            return DUMMY_ERROR;
          }
          offset = offset << 8;
          local_28 = local_28 << 8 | (uint)(byte)*probLit;
          probLit = (UInt16 *)((long)probLit + 1);
        }
        uVar4 = (offset >> 0xb) * (uint)*(ushort *)((long)local_48 + (ulong)local_58 * 2);
        if (local_28 < uVar4) {
          local_58 = local_58 * 2;
          offset = uVar4;
        }
        else {
          offset = offset - uVar4;
          local_28 = local_28 - uVar4;
          local_58 = local_58 * 2 + 1;
        }
      } while (local_58 < 0x100);
    }
    else {
      if (*(ulong *)(in_RDI + 0xc) < (ulong)(uint)in_RDI[0x13]) {
        local_c8 = *(long *)(in_RDI + 0xe);
      }
      else {
        local_c8 = 0;
      }
      local_5c = (uint)*(byte *)(*(long *)(in_RDI + 6) +
                                (*(long *)(in_RDI + 0xc) - (ulong)(uint)in_RDI[0x13]) + local_c8);
      local_60 = 0x100;
      local_64 = 1;
      do {
        local_5c = local_5c << 1;
        uVar4 = local_5c & local_60;
        if (offset < 0x1000000) {
          if (pUVar5 <= probLit) {
            return DUMMY_ERROR;
          }
          offset = offset << 8;
          local_28 = local_28 << 8 | (uint)(byte)*probLit;
          probLit = (UInt16 *)((long)probLit + 1);
        }
        uVar2 = (offset >> 0xb) *
                (uint)*(ushort *)
                       ((long)local_48 + (ulong)local_60 * 2 + (ulong)uVar4 * 2 +
                       (ulong)local_64 * 2);
        if (local_28 < uVar2) {
          local_64 = local_64 * 2;
          uVar4 = uVar4 ^ 0xffffffff;
          offset = uVar2;
        }
        else {
          offset = offset - uVar2;
          local_28 = local_28 - uVar2;
          local_64 = local_64 * 2 + 1;
        }
        local_60 = uVar4 & local_60;
      } while (local_64 < 0x100);
    }
    local_40 = 1;
  }
  else {
    offset = offset - uVar3;
    local_28 = local_28 - uVar3;
    if (offset < 0x1000000) {
      if (pUVar5 <= probLit) {
        return DUMMY_ERROR;
      }
      offset = offset * 0x100;
      local_28 = local_28 * 0x100 | (uint)(byte)*probLit;
      probLit = (UInt16 *)((long)probLit + 1);
    }
    uVar3 = (offset >> 0xb) * (uint)*(ushort *)(lVar1 + 0x180 + (ulong)uVar4 * 2);
    if (local_28 < uVar3) {
      i = 0;
      local_48 = (ushort *)(lVar1 + 0x664);
      local_40 = 2;
      offset = uVar3;
    }
    else {
      offset = offset - uVar3;
      local_28 = local_28 - uVar3;
      local_40 = 3;
      if (offset < 0x1000000) {
        if (pUVar5 <= probLit) {
          return DUMMY_ERROR;
        }
        offset = offset * 0x100;
        local_28 = local_28 * 0x100 | (uint)(byte)*probLit;
        probLit = (UInt16 *)((long)probLit + 1);
      }
      uVar3 = (offset >> 0xb) * (uint)*(ushort *)(lVar1 + 0x198 + (ulong)uVar4 * 2);
      if (local_28 < uVar3) {
        offset = uVar3;
        if (uVar3 < 0x1000000) {
          if (pUVar5 <= probLit) {
            return DUMMY_ERROR;
          }
          offset = uVar3 * 0x100;
          local_28 = local_28 << 8 | (uint)(byte)*probLit;
          probLit = (UInt16 *)((long)probLit + 1);
        }
        uVar4 = (offset >> 0xb) *
                (uint)*(ushort *)(lVar1 + 0x1e0 + (ulong)(uVar4 << 4) * 2 + (ulong)uVar2 * 2);
        if (local_28 < uVar4) {
          if ((uVar4 < 0x1000000) && (pUVar5 <= probLit)) {
            return DUMMY_ERROR;
          }
          return DUMMY_REP;
        }
        local_28 = local_28 - uVar4;
        uVar3 = offset - uVar4;
      }
      else {
        offset = offset - uVar3;
        local_28 = local_28 - uVar3;
        if (offset < 0x1000000) {
          if (pUVar5 <= probLit) {
            return DUMMY_ERROR;
          }
          offset = offset * 0x100;
          local_28 = local_28 * 0x100 | (uint)(byte)*probLit;
          probLit = (UInt16 *)((long)probLit + 1);
        }
        uVar3 = (offset >> 0xb) * (uint)*(ushort *)(lVar1 + 0x1b0 + (ulong)uVar4 * 2);
        if (uVar3 <= local_28) {
          offset = offset - uVar3;
          local_28 = local_28 - uVar3;
          if (offset < 0x1000000) {
            if (pUVar5 <= probLit) {
              return DUMMY_ERROR;
            }
            offset = offset * 0x100;
            local_28 = local_28 * 0x100 | (uint)(byte)*probLit;
            probLit = (UInt16 *)((long)probLit + 1);
          }
          uVar3 = (offset >> 0xb) * (uint)*(ushort *)(lVar1 + 0x1c8 + (ulong)uVar4 * 2);
          if (uVar3 <= local_28) {
            local_28 = local_28 - uVar3;
            uVar3 = offset - uVar3;
          }
        }
      }
      offset = uVar3;
      i = 0xc;
      local_48 = (ushort *)(lVar1 + 0xa68);
    }
    if (offset < 0x1000000) {
      if (pUVar5 <= probLit) {
        return DUMMY_ERROR;
      }
      offset = offset << 8;
      local_28 = local_28 << 8 | (uint)(byte)*probLit;
      probLit = (UInt16 *)((long)probLit + 1);
    }
    uVar4 = (offset >> 0xb) * (uint)*local_48;
    if (local_28 < uVar4) {
      local_88 = local_48 + (ulong)(uVar2 << 3) + 2;
      local_7c = 0;
      local_78 = 8;
      offset = uVar4;
    }
    else {
      offset = offset - uVar4;
      local_28 = local_28 - uVar4;
      if (offset < 0x1000000) {
        if (pUVar5 <= probLit) {
          return DUMMY_ERROR;
        }
        offset = offset * 0x100;
        local_28 = local_28 * 0x100 | (uint)(byte)*probLit;
        probLit = (UInt16 *)((long)probLit + 1);
      }
      uVar4 = (offset >> 0xb) * (uint)local_48[1];
      if (local_28 < uVar4) {
        local_88 = local_48 + (ulong)(uVar2 << 3) + 0x82;
        local_7c = 8;
        local_78 = 8;
        offset = uVar4;
      }
      else {
        offset = offset - uVar4;
        local_28 = local_28 - uVar4;
        local_88 = local_48 + 0x102;
        local_7c = 0x10;
        local_78 = 0x100;
      }
    }
    local_74 = 1;
    do {
      if (offset < 0x1000000) {
        if (pUVar5 <= probLit) {
          return DUMMY_ERROR;
        }
        offset = offset << 8;
        local_28 = local_28 << 8 | (uint)(byte)*probLit;
        probLit = (UInt16 *)((long)probLit + 1);
      }
      uVar4 = (offset >> 0xb) * (uint)local_88[local_74];
      if (local_28 < uVar4) {
        local_74 = local_74 * 2;
        offset = uVar4;
      }
      else {
        offset = offset - uVar4;
        local_28 = local_28 - uVar4;
        local_74 = local_74 * 2 + 1;
      }
    } while (local_74 < local_78);
    local_d4 = local_7c + (local_74 - local_78);
    if (i < 4) {
      if (3 < local_d4) {
        local_d4 = 3;
      }
      local_8c = 1;
      do {
        if (offset < 0x1000000) {
          if (pUVar5 <= probLit) {
            return DUMMY_ERROR;
          }
          offset = offset << 8;
          local_28 = local_28 << 8 | (uint)(byte)*probLit;
          probLit = (UInt16 *)((long)probLit + 1);
        }
        uVar4 = (offset >> 0xb) *
                (uint)*(ushort *)(lVar1 + 0x360 + (ulong)(local_d4 << 6) * 2 + (ulong)local_8c * 2);
        if (local_28 < uVar4) {
          local_8c = local_8c * 2;
          offset = uVar4;
        }
        else {
          offset = offset - uVar4;
          local_28 = local_28 - uVar4;
          local_8c = local_8c * 2 + 1;
        }
      } while (local_8c < 0x40);
      local_8c = local_8c - 0x40;
      if (3 < local_8c) {
        local_90 = (local_8c >> 1) - 1;
        if (local_8c < 0xe) {
          local_48 = (ushort *)
                     (lVar1 + (ulong)((local_8c & 1 | 2) << ((byte)local_90 & 0x1f)) * 2 +
                      (ulong)local_8c * -2 + 0x55e);
        }
        else {
          local_90 = (local_8c >> 1) - 5;
          do {
            if (offset < 0x1000000) {
              if (pUVar5 <= probLit) {
                return DUMMY_ERROR;
              }
              offset = offset << 8;
              local_28 = local_28 << 8 | (uint)(byte)*probLit;
              probLit = (UInt16 *)((long)probLit + 1);
            }
            offset = offset >> 1;
            local_28 = local_28 - (offset & 0xffffffffU - ((int)(local_28 - offset) >> 0x1f));
            local_90 = local_90 + -1;
          } while (local_90 != 0);
          local_48 = (ushort *)(lVar1 + 0x644);
          local_90 = 4;
        }
        local_94 = 1;
        do {
          if (offset < 0x1000000) {
            if (pUVar5 <= probLit) {
              return DUMMY_ERROR;
            }
            offset = offset << 8;
            local_28 = local_28 << 8 | (uint)(byte)*probLit;
            probLit = (UInt16 *)((long)probLit + 1);
          }
          uVar4 = (offset >> 0xb) * (uint)*(ushort *)((long)local_48 + (ulong)local_94 * 2);
          if (local_28 < uVar4) {
            local_94 = local_94 * 2;
            offset = uVar4;
          }
          else {
            offset = offset - uVar4;
            local_28 = local_28 - uVar4;
            local_94 = local_94 * 2 + 1;
          }
          local_90 = local_90 + -1;
        } while (local_90 != 0);
      }
    }
  }
  if ((offset < 0x1000000) && (pUVar5 <= probLit)) {
    matchByte = 0;
  }
  else {
    matchByte = local_40;
  }
  return matchByte;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, SizeT inSize)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = buf + inSize;
  const CLzmaProb *probs = p->probs;
  unsigned state = p->state;
  ELzmaDummy res;

  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = (p->processedPos) & ((1 << p->prop.pb) - 1);

    prob = probs + IsMatch + (state << kNumPosBitsMax) + posState;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      /* if (bufLimit - buf >= 7) return DUMMY_LIT; */

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & ((1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            (p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte <<= 1;
          bit = (matchByte & offs);
          probLit = prob + offs + bit + symbol;
          GET_BIT2_CHECK(probLit, symbol, offs &= ~bit, offs &= bit)
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK;

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK;
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK;
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK;
          prob = probs + IsRep0Long + (state << kNumPosBitsMax) + posState;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
            NORMALIZE_CHECK;
            return DUMMY_REP;
          }
          else
          {
            UPDATE_1_CHECK;
          }
        }
        else
        {
          UPDATE_1_CHECK;
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK;
          }
          else
          {
            UPDATE_1_CHECK;
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK;
            }
            else
            {
              UPDATE_1_CHECK;
            }
          }